

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_split_anything(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  uint argc_00;
  t_list_split *x_00;
  t_atom *argv_00;
  t_atom *ptVar1;
  t_list_split *local_38;
  
  ptVar1 = (t_atom *)&local_38;
  argc_00 = argc + 1;
  local_38 = x;
  if (argc < 99) {
    ptVar1 = (t_atom *)(&local_38 + (long)(int)argc_00 * -2);
    argv_00 = ptVar1;
  }
  else {
    argv_00 = (t_atom *)getbytes((ulong)argc_00 << 4);
  }
  argv_00->a_type = A_SYMBOL;
  (argv_00->a_w).w_symbol = s;
  ptVar1[-1].a_w.w_symbol = (t_symbol *)0x17d30e;
  atoms_copy(argc,argv,argv_00 + 1);
  x_00 = local_38;
  ptVar1[-1].a_w.w_symbol = (t_symbol *)0x17d31d;
  list_split_list(x_00,(t_symbol *)argv,argc_00,argv_00);
  if (0x62 < argc) {
    ptVar1[-1].a_w.w_symbol = (t_symbol *)0x17d332;
    freebytes(argv_00,(ulong)argc_00 << 4);
  }
  return;
}

Assistant:

static void list_split_anything(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    ATOMS_ALLOCA(outv, argc+1);
    SETSYMBOL(outv, s);
    atoms_copy(argc, argv, outv + 1);
    list_split_list(x, &s_list, argc+1, outv);
    ATOMS_FREEA(outv, argc+1);
}